

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSep.h
# Opt level: O2

StreamSepMaker * __thiscall
Hpipe::StreamSepMaker::rm_beg(StreamSepMaker *__return_storage_ptr__,StreamSepMaker *this,uint n)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  StreamSepMaker(__return_storage_ptr__,this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::resize((ulong)&__return_storage_ptr__->beg);
  return __return_storage_ptr__;
}

Assistant:

StreamSepMaker rm_beg( unsigned n ) {
        StreamSepMaker res = *this;
        res.beg.resize( beg.size() - std::min( unsigned( beg.size() ), n ) );
        return res;
    }